

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O2

void __thiscall
Assimp::PretransformVertices::GetVFormatList
          (PretransformVertices *this,aiScene *pcScene,uint iMat,
          list<unsigned_int,_std::allocator<unsigned_int>_> *aiOut)

{
  uint i;
  ulong uVar1;
  uint local_2c;
  
  for (uVar1 = 0; uVar1 < pcScene->mNumMeshes; uVar1 = uVar1 + 1) {
    if (pcScene->mMeshes[uVar1]->mMaterialIndex == iMat) {
      local_2c = GetMeshVFormat(this,pcScene->mMeshes[uVar1]);
      this = (PretransformVertices *)aiOut;
      std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back(aiOut,&local_2c);
    }
  }
  return;
}

Assistant:

void PretransformVertices::GetVFormatList( aiScene* pcScene, unsigned int iMat,
    std::list<unsigned int>& aiOut)
{
    for (unsigned int i = 0; i < pcScene->mNumMeshes;++i)
    {
        aiMesh* pcMesh = pcScene->mMeshes[ i ];
        if (iMat == pcMesh->mMaterialIndex) {
            aiOut.push_back(GetMeshVFormat(pcMesh));
        }
    }
}